

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# exrmetrics.cpp
# Opt level: O2

void writeFile(MultiPartOutputFile *out,vector<partData,_std::allocator<partData>_> *parts,
              fileMetrics *metrics,bool logPerformance)

{
  __type _Var1;
  string *psVar2;
  vector<double,_std::allocator<double>_> *pvVar3;
  int iVar4;
  ulong uVar5;
  long lVar6;
  long local_70;
  OutputPart outpart;
  string type;
  
  local_70 = 0x30;
  lVar6 = 0xc0;
  for (uVar5 = 0;
      uVar5 < (ulong)(((long)(parts->super__Vector_base<partData,_std::allocator<partData>_>).
                             _M_impl.super__Vector_impl_data._M_finish -
                      (long)(parts->super__Vector_base<partData,_std::allocator<partData>_>)._M_impl
                            .super__Vector_impl_data._M_start) / 0x250); uVar5 = uVar5 + 1) {
    Imf_3_4::MultiPartOutputFile::header((int)out);
    psVar2 = (string *)Imf_3_4::Header::type_abi_cxx11_();
    std::__cxx11::string::string((string *)&type,psVar2);
    _Var1 = std::operator==(&type,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                   *)Imf_3_4::SCANLINEIMAGE_abi_cxx11_);
    iVar4 = (int)uVar5;
    if (_Var1) {
      Imf_3_4::OutputPart::OutputPart(&outpart,out,iVar4);
      pvVar3 = (vector<double,_std::allocator<double>_> *)
               ((long)&(((metrics->stats).super__Vector_base<partStats,_std::allocator<partStats>_>.
                         _M_impl.super__Vector_impl_data._M_start)->countReadPerf).
                       super__Vector_base<double,_std::allocator<double>_> + local_70);
      if (!logPerformance) {
        pvVar3 = (vector<double,_std::allocator<double>_> *)0x0;
      }
      writeScanLine(&outpart,(FrameBuffer *)
                             ((long)(parts->super__Vector_base<partData,_std::allocator<partData>_>)
                                    ._M_impl.super__Vector_impl_data._M_start + lVar6 + -0x48),
                    pvVar3);
    }
    else {
      _Var1 = std::operator==(&type,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                     *)Imf_3_4::TILEDIMAGE_abi_cxx11_);
      if (_Var1) {
        Imf_3_4::TiledOutputPart::TiledOutputPart((TiledOutputPart *)&outpart,out,iVar4);
        pvVar3 = (vector<double,_std::allocator<double>_> *)
                 ((long)&(((metrics->stats).
                           super__Vector_base<partStats,_std::allocator<partStats>_>._M_impl.
                           super__Vector_impl_data._M_start)->countReadPerf).
                         super__Vector_base<double,_std::allocator<double>_> + local_70);
        if (!logPerformance) {
          pvVar3 = (vector<double,_std::allocator<double>_> *)0x0;
        }
        writeTiled((TiledOutputPart *)&outpart,
                   (vector<Imf_3_4::FrameBuffer,_std::allocator<Imf_3_4::FrameBuffer>_> *)
                   ((long)(parts->super__Vector_base<partData,_std::allocator<partData>_>)._M_impl.
                          super__Vector_impl_data._M_start + lVar6 + -0x18),pvVar3);
      }
      else {
        _Var1 = std::operator==(&type,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                       *)Imf_3_4::DEEPSCANLINE_abi_cxx11_);
        if (_Var1) {
          Imf_3_4::DeepScanLineOutputPart::DeepScanLineOutputPart
                    ((DeepScanLineOutputPart *)&outpart,out,iVar4);
          pvVar3 = (vector<double,_std::allocator<double>_> *)
                   ((long)&(((metrics->stats).
                             super__Vector_base<partStats,_std::allocator<partStats>_>._M_impl.
                             super__Vector_impl_data._M_start)->countReadPerf).
                           super__Vector_base<double,_std::allocator<double>_> + local_70);
          if (!logPerformance) {
            pvVar3 = (vector<double,_std::allocator<double>_> *)0x0;
          }
          writeDeepScanLine((DeepScanLineOutputPart *)&outpart,
                            (DeepFrameBuffer *)
                            ((long)&(((parts->
                                      super__Vector_base<partData,_std::allocator<partData>_>).
                                      _M_impl.super__Vector_impl_data._M_start)->readBuf).
                                    scanlinePixelData.
                                    super__Vector_base<std::vector<char,_std::allocator<char>_>,_std::allocator<std::vector<char,_std::allocator<char>_>_>_>
                            + lVar6),pvVar3);
        }
        else {
          _Var1 = std::operator==(&type,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                         *)Imf_3_4::DEEPTILE_abi_cxx11_);
          if (_Var1) {
            Imf_3_4::DeepTiledOutputPart::DeepTiledOutputPart
                      ((DeepTiledOutputPart *)&outpart,out,iVar4);
            pvVar3 = (vector<double,_std::allocator<double>_> *)
                     ((long)&(((metrics->stats).
                               super__Vector_base<partStats,_std::allocator<partStats>_>._M_impl.
                               super__Vector_impl_data._M_start)->countReadPerf).
                             super__Vector_base<double,_std::allocator<double>_> + local_70);
            if (!logPerformance) {
              pvVar3 = (vector<double,_std::allocator<double>_> *)0x0;
            }
            writeDeepTiled((DeepTiledOutputPart *)&outpart,
                           (DeepFrameBuffer *)
                           ((long)&(((parts->super__Vector_base<partData,_std::allocator<partData>_>
                                     )._M_impl.super__Vector_impl_data._M_start)->readBuf).
                                   scanlinePixelData.
                                   super__Vector_base<std::vector<char,_std::allocator<char>_>,_std::allocator<std::vector<char,_std::allocator<char>_>_>_>
                           + lVar6),pvVar3);
          }
        }
      }
    }
    std::__cxx11::string::~string((string *)&type);
    local_70 = local_70 + 0xc0;
    lVar6 = lVar6 + 0x250;
  }
  return;
}

Assistant:

void
writeFile (
    MultiPartOutputFile& out,
    vector<partData>&    parts,
    fileMetrics&         metrics,
    bool                 logPerformance)
{
    //
    // Call initialization functions, Read image from source.
    //
    for (size_t p = 0; p < parts.size (); ++p)
    {
        string type = out.header (p).type ();

        if (type == SCANLINEIMAGE)
        {
            OutputPart outpart (out, p);
            writeScanLine (
                outpart,
                parts[p].readBuf.scanlineBuf,
                logPerformance ? &metrics.stats[p].writePerf : nullptr);
        }
        else if (type == TILEDIMAGE)
        {
            TiledOutputPart outpart (out, p);
            writeTiled (
                outpart,
                parts[p].readBuf.tiledBuf,
                logPerformance ? &metrics.stats[p].writePerf : nullptr);
        }
        else if (type == DEEPSCANLINE)
        {
            DeepScanLineOutputPart outpart (out, p);
            writeDeepScanLine (
                outpart,
                parts[p].readBuf.deepbuf,
                logPerformance ? &metrics.stats[p].writePerf : nullptr);
        }
        else if (type == DEEPTILE)
        {
            DeepTiledOutputPart outpart (out, p);
            writeDeepTiled (
                outpart,
                parts[p].readBuf.deepbuf,
                logPerformance ? &metrics.stats[p].writePerf : nullptr);
        }
    }
}